

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::DecimalMatcher::smokeTest(DecimalMatcher *this,StringSegment *segment)

{
  UBool UVar1;
  bool bVar2;
  UChar32 c;
  UnicodeString *other;
  int local_24;
  int32_t i;
  StringSegment *segment_local;
  DecimalMatcher *this_local;
  
  UVar1 = LocalPointerBase<const_icu_63::UnicodeString>::isNull
                    (&(this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>
                    );
  if ((UVar1 == '\0') || (this->leadSet == (UnicodeSet *)0x0)) {
    bVar2 = StringSegment::startsWith(segment,this->separatorSet);
    if (!bVar2) {
      c = StringSegment::getCodePoint(segment);
      UVar1 = u_isdigit_63(c);
      if (UVar1 == '\0') {
        UVar1 = LocalPointerBase<const_icu_63::UnicodeString>::isNull
                          (&(this->fLocalDigitStrings).
                            super_LocalPointerBase<const_icu_63::UnicodeString>);
        if (UVar1 != '\0') {
          return false;
        }
        local_24 = 0;
        while( true ) {
          if (9 < local_24) {
            return false;
          }
          other = LocalArray<const_icu_63::UnicodeString>::operator[]
                            (&this->fLocalDigitStrings,(long)local_24);
          bVar2 = StringSegment::startsWith(segment,other);
          if (bVar2) break;
          local_24 = local_24 + 1;
        }
        return true;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = StringSegment::startsWith(segment,this->leadSet);
  }
  return this_local._7_1_;
}

Assistant:

bool DecimalMatcher::smokeTest(const StringSegment& segment) const {
    // The common case uses a static leadSet for efficiency.
    if (fLocalDigitStrings.isNull() && leadSet != nullptr) {
        return segment.startsWith(*leadSet);
    }
    if (segment.startsWith(*separatorSet) || u_isdigit(segment.getCodePoint())) {
        return true;
    }
    if (fLocalDigitStrings.isNull()) {
        return false;
    }
    for (int32_t i = 0; i < 10; i++) {
        if (segment.startsWith(fLocalDigitStrings[i])) {
            return true;
        }
    }
    return false;
}